

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comparator.cc
# Opt level: O3

void __thiscall
leveldb::anon_unknown_2::BytewiseComparatorImpl::FindShortestSeparator
          (BytewiseComparatorImpl *this,string *start,Slice *limit)

{
  byte bVar1;
  pointer pcVar2;
  int iVar3;
  ulong uVar4;
  size_type __n;
  long in_FS_OFFSET;
  bool bVar5;
  pointer local_30;
  size_type local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = start->_M_string_length;
  if (limit->size_ < start->_M_string_length) {
    uVar4 = limit->size_;
  }
  if (uVar4 != 0) {
    pcVar2 = (start->_M_dataplus)._M_p;
    __n = 1;
    do {
      bVar1 = pcVar2[__n - 1];
      if (bVar1 != limit->data_[__n - 1]) {
        if ((bVar1 != 0xff) && (bVar1 + 1 < (uint)(byte)limit->data_[__n - 1])) {
          pcVar2[__n - 1] = bVar1 + 1;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
                    (start,__n,'\0');
          local_30 = (start->_M_dataplus)._M_p;
          local_28 = start->_M_string_length;
          iVar3 = (*(this->super_Comparator)._vptr_Comparator[2])(this,&local_30,limit);
          if (-1 < iVar3) {
            __assert_fail("Compare(*start, limit) < 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/util/comparator.cc"
                          ,0x31,
                          "virtual void leveldb::(anonymous namespace)::BytewiseComparatorImpl::FindShortestSeparator(std::string *, const Slice &) const"
                         );
          }
        }
        break;
      }
      bVar5 = __n != uVar4;
      __n = __n + 1;
    } while (bVar5);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void FindShortestSeparator(std::string* start,
                             const Slice& limit) const override {
    // Find length of common prefix
    size_t min_length = std::min(start->size(), limit.size());
    size_t diff_index = 0;
    while ((diff_index < min_length) &&
           ((*start)[diff_index] == limit[diff_index])) {
      diff_index++;
    }

    if (diff_index >= min_length) {
      // Do not shorten if one string is a prefix of the other
    } else {
      uint8_t diff_byte = static_cast<uint8_t>((*start)[diff_index]);
      if (diff_byte < static_cast<uint8_t>(0xff) &&
          diff_byte + 1 < static_cast<uint8_t>(limit[diff_index])) {
        (*start)[diff_index]++;
        start->resize(diff_index + 1);
        assert(Compare(*start, limit) < 0);
      }
    }
  }